

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeDefUse(DefUseManager *this,Module *module)

{
  _Any_data local_50;
  _Manager_type local_40;
  _Bind<void_(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>))(spvtools::opt::Instruction_*)>
  local_30;
  
  if (module != (Module *)0x0) {
    local_30._M_f = (offset_in_DefUseManager_to_subr)AnalyzeInstDef;
    local_30._8_8_ = 0;
    local_30._M_bound_args.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>_>)
         (_Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>_>)this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<std::_Bind<void(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager*,std::_Placeholder<1>))(spvtools::opt::Instruction*)>,void>
              ((function<void(spvtools::opt::Instruction*)> *)local_50._M_pod_data,&local_30);
    Module::ForEachInst(module,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,true);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    local_30._M_f = (offset_in_DefUseManager_to_subr)AnalyzeInstUse;
    local_30._8_8_ = 0;
    local_30._M_bound_args.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>_>)
         (_Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>_>)this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<std::_Bind<void(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager*,std::_Placeholder<1>))(spvtools::opt::Instruction*)>,void>
              ((function<void(spvtools::opt::Instruction*)> *)local_50._M_pod_data,&local_30);
    Module::ForEachInst(module,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,true);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  return;
}

Assistant:

void DefUseManager::AnalyzeDefUse(Module* module) {
  if (!module) return;
  // Analyze all the defs before any uses to catch forward references.
  module->ForEachInst(
      std::bind(&DefUseManager::AnalyzeInstDef, this, std::placeholders::_1),
      true);
  module->ForEachInst(
      std::bind(&DefUseManager::AnalyzeInstUse, this, std::placeholders::_1),
      true);
}